

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O1

void apx_socketServer_destroy(apx_socketServer_t *self)

{
  if (self != (apx_socketServer_t *)0x0) {
    if (self->unix_server_file != (char *)0x0) {
      free(self->unix_server_file);
    }
    if (self->tcp_connection_tag != (char *)0x0) {
      free(self->tcp_connection_tag);
    }
    if (self->unix_connection_tag != (char *)0x0) {
      free(self->unix_connection_tag);
      return;
    }
  }
  return;
}

Assistant:

void apx_socketServer_destroy(apx_socketServer_t *self)
{
   if (self != 0)
   {
      if (self->unix_server_file != 0)
      {
         free(self->unix_server_file);
      }
      if (self->tcp_connection_tag != 0)
      {
         free(self->tcp_connection_tag);
      }
      if (self->unix_connection_tag != 0)
      {
         free(self->unix_connection_tag);
      }
   }
}